

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.h
# Opt level: O1

void __thiscall
TxInUndoFormatter::Unser<HashVerifier<AutoFile>>
          (TxInUndoFormatter *this,HashVerifier<AutoFile> *s,Coin *txout)

{
  uint uVar1;
  long in_FS_OFFSET;
  Wrapper<ScriptCompression,_CScript_&> local_28;
  Wrapper<AmountCompression,_long_&> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = ReadVarInt<HashVerifier<AutoFile>,(VarIntMode)0,unsigned_int>(s);
  *(uint *)&txout->field_0x28 = uVar1;
  if (1 < uVar1) {
    ReadVarInt<HashVerifier<AutoFile>,(VarIntMode)0,unsigned_int>(s);
  }
  local_28.m_object = &(txout->out).scriptPubKey;
  local_20.m_object = (long *)txout;
  ActionUnserialize::
  SerReadWriteMany<HashVerifier<AutoFile>,Wrapper<AmountCompression,long&>,Wrapper<ScriptCompression,CScript&>>
            (s,&local_20,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream &s, Coin& txout) {
        uint32_t nCode = 0;
        ::Unserialize(s, VARINT(nCode));
        txout.nHeight = nCode >> 1;
        txout.fCoinBase = nCode & 1;
        if (txout.nHeight > 0) {
            // Old versions stored the version number for the last spend of
            // a transaction's outputs. Non-final spends were indicated with
            // height = 0.
            unsigned int nVersionDummy;
            ::Unserialize(s, VARINT(nVersionDummy));
        }
        ::Unserialize(s, Using<TxOutCompression>(txout.out));
    }